

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O3

void __thiscall tf::Executor::_invoke(Executor *this,Worker *worker,Node *node)

{
  long *plVar1;
  size_t *psVar2;
  __uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_> _Var3;
  long lVar4;
  U *g;
  void *pvVar5;
  bool bVar6;
  byte bVar7;
  undefined4 uVar8;
  int iVar9;
  U UVar10;
  long lVar11;
  ulong uVar12;
  U UVar13;
  long lVar14;
  atomic<unsigned_long> *paVar15;
  U *pUVar16;
  _Hash_node_base *p_Var17;
  U *pUVar18;
  SmallVector<tf::Node_*,_2U> nodes;
  SmallVector<int,_2U> conds;
  U local_a8;
  U local_a0;
  U local_98;
  U local_90;
  char local_88;
  pthread_mutex_t *local_80;
  U local_78;
  SmallVectorImpl<int> local_70;
  pthread_mutex_t *local_50;
  TaskQueue<tf::Node_*> *local_48;
  Notifier *local_40;
  TaskQueue<tf::Node_*> *local_38;
  
  do {
  } while (((node->_state).super___atomic_base<int>._M_i & 8U) == 0);
  local_50 = (pthread_mutex_t *)&this->_topology_mutex;
  local_80 = (pthread_mutex_t *)&this->_wsq_mutex;
  local_38 = &this->_wsq;
  local_40 = &this->_notifier;
  local_48 = &worker->_wsq;
  local_78 = (U)worker;
  do {
    pUVar18 = &local_70.super_SmallVectorTemplateBase<int,_true>.
               super_SmallVectorTemplateCommon<int,_void>.FirstEl;
    bVar7 = ((U *)((long)node + 0x68))->__data[0];
    if ((((bVar7 == 6) && (*(byte **)((U *)((long)node + 0x50))->__data != (byte *)0x0)) &&
        ((**(byte **)((U *)((long)node + 0x50))->__data & 1) != 0)) ||
       ((*(U *)((long)node + 0xc0) != (U)0x0 && ((*(byte *)*(U *)((long)node + 0xc0) & 1) != 0)))) {
      _cancel_invoke(this,worker,node);
      return;
    }
    _Var3._M_t.
    super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
    super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl =
         *(tuple<tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_> *)
          ((U *)((long)node + 0xe0))->__data;
    if (((__uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>)
         _Var3._M_t.
         super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
         super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>)0x0) &&
       (*(long *)_Var3._M_t.
                 super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                 .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl !=
        *(long *)((long)_Var3._M_t.
                        super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                        .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl + 8))) {
      local_a8 = (U)&local_90;
      local_98 = (U)&local_80;
      local_a0 = local_a8;
      bVar6 = Node::_acquire_all(node,(SmallVector<tf::Node_*,_2U> *)&local_a8.__align);
      if (bVar6) {
        LOCK();
        *(uint *)((long)node + 0xd0) =
             ((__int_type)*(__atomic_base<int> *)((long)node + 0xd0))._M_i | 4;
        UNLOCK();
      }
      else {
        _schedule(this,worker,(SmallVector<tf::Node_*,_2U> *)&local_a8.__align);
      }
      if (local_a8 != (U)&local_90) {
        free((void *)local_a8);
      }
      if (!bVar6) {
        return;
      }
      bVar7 = ((U *)((long)node + 0x68))->__data[0];
    }
    local_70.super_SmallVectorTemplateBase<int,_true>.super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.CapacityX = &local_50;
    local_70.super_SmallVectorTemplateBase<int,_true>.super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.BeginX = pUVar18;
    local_70.super_SmallVectorTemplateBase<int,_true>.super_SmallVectorTemplateCommon<int,_void>.
    super_SmallVectorBase.EndX = pUVar18;
    if (9 < bVar7 - 1) goto LAB_0012b8ac;
    pUVar16 = (U *)((long)node + 0x30);
    switch((uint)bVar7) {
    case 1:
      p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
      if (p_Var17 != (_Hash_node_base *)0x0) {
        do {
          (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
          p_Var17 = p_Var17->_M_nxt;
        } while (p_Var17 != (_Hash_node_base *)0x0);
        if (((U *)((long)node + 0x68))->__data[0] != '\x01') {
          pUVar16 = (U *)0x0;
        }
      }
      if (pUVar16[2] == (U)0x0) goto LAB_0012bbf2;
      (*(code *)pUVar16[3])(pUVar16);
      for (p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
        (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
      }
      break;
    case 2:
      p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
      if (p_Var17 != (_Hash_node_base *)0x0) {
        do {
          (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
          p_Var17 = p_Var17->_M_nxt;
        } while (p_Var17 != (_Hash_node_base *)0x0);
        if (((U *)((long)node + 0x68))->__data[0] != '\x02') {
          pUVar16 = (U *)0x0;
        }
      }
      UVar10 = *(U *)pUVar16[4].__data;
      UVar13 = pUVar16[5];
      if (UVar10 != UVar13) {
        do {
          ObjectPool<tf::Node,_65536UL>::recycle
                    ((ObjectPool<tf::Node,_65536UL> *)node_pool,*(Node **)UVar10);
          UVar10.__data = UVar10.__data + 8;
        } while (UVar10 != UVar13);
        if (pUVar16[5] != pUVar16[4]) {
          pUVar16[5] = pUVar16[4];
        }
      }
      worker = (Worker *)local_78;
      g = pUVar16 + 4;
      local_98 = local_78;
      local_88 = '\x01';
      local_a8 = (U)g;
      local_a0 = (U)this;
      local_90 = (U)node;
      if (pUVar16[2] == (U)0x0) goto LAB_0012bbf2;
      (*(code *)pUVar16[3])(pUVar16);
      if (local_88 == '\x01') {
        _join_dynamic_task_internal(this,worker,node,(Graph *)&g->__align);
      }
      for (p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
        (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
      }
      break;
    case 3:
      p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
      if (p_Var17 != (_Hash_node_base *)0x0) {
        do {
          (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
          p_Var17 = p_Var17->_M_nxt;
        } while (p_Var17 != (_Hash_node_base *)0x0);
        if (((U *)((long)node + 0x68))->__data[0] != '\x03') {
          pUVar16 = (U *)0x0;
        }
      }
      if (pUVar16[2] == (U)0x0) goto LAB_0012bbf2;
      uVar8 = (*(code *)pUVar16[3])(pUVar16);
      local_a8._0_4_ = uVar8;
      local_70.super_SmallVectorTemplateBase<int,_true>.super_SmallVectorTemplateCommon<int,_void>.
      super_SmallVectorBase.EndX =
           local_70.super_SmallVectorTemplateBase<int,_true>.
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
      SmallVectorImpl<int>::append<int_const*>
                (&local_70,(int *)local_a8.__data,(int *)(local_a8.__data + 4));
      for (p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
        (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
      }
      break;
    case 4:
      p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
      if (p_Var17 != (_Hash_node_base *)0x0) {
        do {
          (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
          p_Var17 = p_Var17->_M_nxt;
        } while (p_Var17 != (_Hash_node_base *)0x0);
        if (((U *)((long)node + 0x68))->__data[0] != '\x04') {
          pUVar16 = (U *)0x0;
        }
      }
      if (pUVar16[2] == (U)0x0) goto LAB_0012bbf2;
      (*(code *)pUVar16[3])(&local_a8,pUVar16);
      SmallVectorImpl<int>::operator=(&local_70,(SmallVectorImpl<int> *)&local_a8.__align);
      if (local_a8 != (U)&local_90) {
        free((void *)local_a8);
      }
      for (p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
        (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
      }
      break;
    case 5:
      for (p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
        (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
      }
      _join_dynamic_task_internal(this,worker,node,(Graph *)*(U *)((long)node + 0x30));
      for (p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
        (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
      }
      break;
    case 6:
      p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
      if (p_Var17 != (_Hash_node_base *)0x0) {
        do {
          (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
          p_Var17 = p_Var17->_M_nxt;
        } while (p_Var17 != (_Hash_node_base *)0x0);
        if (((U *)((long)node + 0x68))->__data[0] != '\x06') {
          pUVar16 = (U *)0x0;
        }
      }
      local_a8.__data = local_a8.__data & 0xffffffffffffff00;
      if (pUVar16[2] == (U)0x0) goto LAB_0012bbf2;
      (*(code *)pUVar16[3])(pUVar16,&local_a8);
      for (p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
        (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
      }
LAB_0012b7d8:
      if (*(U *)((long)node + 200) == (U)0x0) {
        iVar9 = pthread_mutex_lock(local_50);
        if (iVar9 != 0) goto LAB_0012bbf7;
        psVar2 = &this->_num_topologies;
        *psVar2 = *psVar2 - 1;
        if (*psVar2 == 0) {
          std::condition_variable::notify_all();
        }
        pthread_mutex_unlock(local_50);
      }
      else {
        LOCK();
        paVar15 = (atomic<unsigned_long> *)((long)*(U *)((long)node + 200) + 0xd8);
        (paVar15->super___atomic_base<unsigned_long>)._M_i =
             (paVar15->super___atomic_base<unsigned_long>)._M_i - 1;
        UNLOCK();
      }
      bVar6 = true;
      ObjectPool<tf::Node,_65536UL>::recycle((ObjectPool<tf::Node,_65536UL> *)node_pool,node);
      goto LAB_0012bb64;
    case 7:
      p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
      if (p_Var17 != (_Hash_node_base *)0x0) {
        do {
          (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
          p_Var17 = p_Var17->_M_nxt;
        } while (p_Var17 != (_Hash_node_base *)0x0);
        if (((U *)((long)node + 0x68))->__data[0] != '\a') {
          pUVar16 = (U *)0x0;
        }
      }
      if (pUVar16[2] != (U)0x0) {
        (*(code *)pUVar16[3])(pUVar16);
        for (p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
            p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
          (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
        }
        goto LAB_0012b7d8;
      }
LAB_0012bbf2:
      iVar9 = std::__throw_bad_function_call();
LAB_0012bbf7:
      std::__throw_system_error(iVar9);
    case 8:
      p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
      if (p_Var17 != (_Hash_node_base *)0x0) {
        do {
          (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
          p_Var17 = p_Var17->_M_nxt;
        } while (p_Var17 != (_Hash_node_base *)0x0);
        if (((U *)((long)node + 0x68))->__data[0] != '\b') {
          pUVar16 = (U *)0x0;
        }
      }
      local_a8 = (U)node;
      if (pUVar16[2] == (U)0x0) goto LAB_0012bbf2;
      local_a8 = (U)node;
      (*(code *)pUVar16[3])(pUVar16,this,&local_a8);
      for (p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
        (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
      }
      break;
    case 9:
      p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
      if (p_Var17 != (_Hash_node_base *)0x0) {
        do {
          (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
          p_Var17 = p_Var17->_M_nxt;
        } while (p_Var17 != (_Hash_node_base *)0x0);
        if (((U *)((long)node + 0x68))->__data[0] != '\t') {
          pUVar16 = (U *)0x0;
        }
      }
      local_a8 = (U)node;
      if (pUVar16[2] == (U)0x0) goto LAB_0012bbf2;
      local_a8 = (U)node;
      (*(code *)pUVar16[3])(pUVar16,this,&local_a8);
      for (p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
        (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
      }
      break;
    case 10:
      p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
      if (p_Var17 != (_Hash_node_base *)0x0) {
        do {
          (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
          p_Var17 = p_Var17->_M_nxt;
        } while (p_Var17 != (_Hash_node_base *)0x0);
        if (((U *)((long)node + 0x68))->__data[0] != '\n') {
          pUVar16 = (U *)0x0;
        }
      }
      local_a8 = (U)this;
      local_a0 = (U)worker;
      local_98 = (U)node;
      if (pUVar16[2] == (U)0x0) goto LAB_0012bbf2;
      local_a8 = (U)this;
      (*(code *)pUVar16[3])(pUVar16);
      for (p_Var17 = (this->_observers)._M_h._M_before_begin._M_nxt;
          p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
        (*(code *)(p_Var17[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var17[1]._M_nxt,worker,node);
      }
    }
LAB_0012b8ac:
    _Var3._M_t.
    super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
    super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl =
         *(tuple<tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_> *)
          ((U *)((long)node + 0xe0))->__data;
    if (((__uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>)
         _Var3._M_t.
         super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
         super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>)0x0) &&
       (*(long *)((long)_Var3._M_t.
                        super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                        .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl + 0x28)
        != *(long *)((long)_Var3._M_t.
                           super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>
                           .super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl + 0x30
                    ))) {
      Node::_release_all((SmallVector<tf::Node_*,_2U> *)&local_a8.__align,node);
      _schedule(this,worker,(SmallVector<tf::Node_*,_2U> *)&local_a8.__align);
      if (local_a8 != (U)&local_90) {
        free((void *)local_a8);
      }
    }
    pvVar5 = local_70.super_SmallVectorTemplateBase<int,_true>.
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
    lVar4 = *(long *)((U *)((long)node + 0x98))->__data;
    if ((((__int_type)*(__atomic_base<int> *)((long)node + 0xd0))._M_i & 1U) == 0) {
      UVar10 = (U)((long)*(U *)((long)node + 0xa0) - lVar4 >> 3);
    }
    else {
      lVar11 = (long)*(U *)((long)node + 0xa0) - lVar4;
      if (lVar11 == 0) {
        UVar10 = (U)0x0;
      }
      else {
        lVar11 = lVar11 >> 3;
        lVar14 = 0;
        UVar10 = (U)0x0;
        do {
          UVar10.__data =
               UVar10.__data +
               (ulong)((byte)(*(char *)(*(long *)(lVar4 + lVar14 * 8) + 0x68) - 5U) < 0xfe);
          lVar14 = lVar14 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar14);
      }
    }
    LOCK();
    *(U *)((long)node + 0xd8) = UVar10;
    UNLOCK();
    if (*(U *)((long)node + 200) == (U)0x0) {
      paVar15 = (atomic<unsigned_long> *)((long)*(U *)((long)node + 0xc0) + 0x90);
    }
    else {
      paVar15 = (atomic<unsigned_long> *)((long)*(U *)((long)node + 200) + 0xd8);
    }
    if ((long)(char)((U *)((long)node + 0x68))->__data[0] - 3U < 2) {
      if (local_70.super_SmallVectorTemplateBase<int,_true>.
          super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX ==
          local_70.super_SmallVectorTemplateBase<int,_true>.
          super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX) {
LAB_0012bb08:
        UVar13 = (U)0x0;
      }
      else {
        UVar10 = (U)0x0;
        pUVar18 = (U *)local_70.super_SmallVectorTemplateBase<int,_true>.
                       super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
        do {
          uVar12 = (ulong)(int)*pUVar18;
          UVar13 = UVar10;
          if ((-1 < (long)uVar12) &&
             (uVar12 < (ulong)((long)*(U *)((long)node + 0x78) -
                               *(long *)((U *)((long)node + 0x70))->__data >> 3))) {
            UVar13 = *(U *)((U *)(*(long *)((U *)((long)node + 0x70))->__data + uVar12 * 8))->__data
            ;
            *(U *)((long)UVar13 + 0xd8) = (U)0x0;
            LOCK();
            (paVar15->super___atomic_base<unsigned_long>)._M_i =
                 (paVar15->super___atomic_base<unsigned_long>)._M_i + 1;
            UNLOCK();
            if (UVar10 != (U)0x0) {
              LOCK();
              *(uint *)((long)UVar10 + 0xd0) = *(uint *)((long)UVar10 + 0xd0) | 8;
              UNLOCK();
              if (*(U *)((long)local_78 + 0x10) == (U)this) {
                TaskQueue<tf::Node_*>::push(local_48,(Node *)UVar10);
              }
              else {
                iVar9 = pthread_mutex_lock(local_80);
                if (iVar9 != 0) {
                  std::__throw_system_error(iVar9);
                }
                TaskQueue<tf::Node_*>::push(local_38,(Node *)UVar10);
                pthread_mutex_unlock(local_80);
                Notifier::notify(local_40,false);
              }
            }
          }
          pUVar18 = pUVar18 + 1;
          UVar10 = UVar13;
        } while (pUVar18 != (U *)pvVar5);
      }
    }
    else {
      UVar10 = *(U *)((long)node + 0x70);
      if (*(U *)((long)node + 0x78) == UVar10) goto LAB_0012bb08;
      uVar12 = 0;
      UVar13 = (U)0x0;
      do {
        LOCK();
        plVar1 = (long *)(*(long *)((long)UVar10 + uVar12 * 8) + 0xd8);
        *plVar1 = *plVar1 + -1;
        UNLOCK();
        if (*plVar1 == 0) {
          LOCK();
          (paVar15->super___atomic_base<unsigned_long>)._M_i =
               (paVar15->super___atomic_base<unsigned_long>)._M_i + 1;
          UNLOCK();
          if (UVar13 != (U)0x0) {
            LOCK();
            *(uint *)((long)UVar13 + 0xd0) = *(uint *)((long)UVar13 + 0xd0) | 8;
            UNLOCK();
            if (*(U *)((long)local_78 + 0x10) == (U)this) {
              TaskQueue<tf::Node_*>::push(local_48,(Node *)UVar13);
            }
            else {
              iVar9 = pthread_mutex_lock(local_80);
              if (iVar9 != 0) {
                std::__throw_system_error(iVar9);
              }
              TaskQueue<tf::Node_*>::push(local_38,(Node *)UVar13);
              pthread_mutex_unlock(local_80);
              Notifier::notify(local_40,false);
            }
          }
          UVar10 = *(U *)((U *)((long)node + 0x70))->__data;
          UVar13 = *(U *)((U *)((long)UVar10 + uVar12 * 8))->__data;
        }
        else {
          UVar10 = *(U *)((U *)((long)node + 0x70))->__data;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)((long)*(U *)((long)node + 0x78) - (long)UVar10 >> 3));
    }
    worker = (Worker *)local_78;
    if (*(U *)((long)node + 200) == (U)0x0) {
      LOCK();
      paVar15 = (atomic<unsigned_long> *)((long)*(U *)((long)node + 0xc0) + 0x90);
      (paVar15->super___atomic_base<unsigned_long>)._M_i =
           (paVar15->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
      if ((paVar15->super___atomic_base<unsigned_long>)._M_i == 0) {
        _tear_down_topology(this,(Worker *)local_78,(Topology *)*(U *)((long)node + 0xc0));
      }
    }
    else {
      LOCK();
      paVar15 = (atomic<unsigned_long> *)((long)*(U *)((long)node + 200) + 0xd8);
      (paVar15->super___atomic_base<unsigned_long>)._M_i =
           (paVar15->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
    }
    bVar6 = UVar13 == (U)0x0;
    if (!bVar6) {
      node = (Node *)UVar13;
    }
LAB_0012bb64:
    if ((U *)local_70.super_SmallVectorTemplateBase<int,_true>.
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX !=
        &local_70.super_SmallVectorTemplateBase<int,_true>.
         super_SmallVectorTemplateCommon<int,_void>.FirstEl) {
      free(local_70.super_SmallVectorTemplateBase<int,_true>.
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX);
    }
    if (bVar6) {
      return;
    }
  } while( true );
}

Assistant:

inline void Executor::_invoke(Worker& worker, Node* node) {

  // synchronize all outstanding memory operations caused by reordering
  while(!(node->_state.load(std::memory_order_acquire) & Node::READY));

  begin_invoke:

  // no need to do other things if the topology is cancelled
  if(node->_is_cancelled()) {
    _cancel_invoke(worker, node);
    return;
  }

  // if acquiring semaphore(s) exists, acquire them first
  if(node->_semaphores && !node->_semaphores->to_acquire.empty()) {
    SmallVector<Node*> nodes;
    if(!node->_acquire_all(nodes)) {
      _schedule(worker, nodes);
      return;
    }
    node->_state.fetch_or(Node::ACQUIRED, std::memory_order_release);
  }

  // condition task
  //int cond = -1;
  SmallVector<int> conds;

  // switch is faster than nested if-else due to jump table
  switch(node->_handle.index()) {
    // static task
    case Node::STATIC:{
      _invoke_static_task(worker, node);
    }
    break;

    // dynamic task
    case Node::DYNAMIC: {
      _invoke_dynamic_task(worker, node);
    }
    break;

    // condition task
    case Node::CONDITION: {
      _invoke_condition_task(worker, node, conds);
    }
    break;

    // multi-condition task
    case Node::MULTI_CONDITION: {
      _invoke_multi_condition_task(worker, node, conds);
    }
    break;

    // module task
    case Node::MODULE: {
      _invoke_module_task(worker, node);
    }
    break;

    // async task
    case Node::ASYNC: {
      _invoke_async_task(worker, node);
      _tear_down_async(node);
      return ;
    }
    break;

    // silent async task
    case Node::SILENT_ASYNC: {
      _invoke_silent_async_task(worker, node);
      _tear_down_async(node);
      return ;
    }
    break;

    // cudaflow task
    case Node::CUDAFLOW: {
      _invoke_cudaflow_task(worker, node);
    }
    break;

    // syclflow task
    case Node::SYCLFLOW: {
      _invoke_syclflow_task(worker, node);
    }
    break;

    // runtime task
    case Node::RUNTIME: {
      _invoke_runtime_task(worker, node);
    }
    break;

    // monostate (placeholder)
    default:
    break;
  }

  // if releasing semaphores exist, release them
  if(node->_semaphores && !node->_semaphores->to_release.empty()) {
    _schedule(worker, node->_release_all());
  }

  // We MUST recover the dependency since the graph may have cycles.
  // This must be done before scheduling the successors, otherwise this might cause
  // race condition on the _dependents
  if((node->_state.load(std::memory_order_relaxed) & Node::CONDITIONED)) {
    node->_join_counter = node->num_strong_dependents();
  }
  else {
    node->_join_counter = node->num_dependents();
  }

  // acquire the parent flow counter
  auto& j = (node->_parent) ? node->_parent->_join_counter :
                              node->_topology->_join_counter;

  Node* cache {nullptr};

  // At this point, the node storage might be destructed (to be verified)
  // case 1: non-condition task
  switch(node->_handle.index()) {

    // condition and multi-condition tasks
    case Node::CONDITION:
    case Node::MULTI_CONDITION: {
      for(auto cond : conds) {
        if(cond >= 0 && static_cast<size_t>(cond) < node->_successors.size()) {
          auto s = node->_successors[cond];
          // zeroing the join counter for invariant
          s->_join_counter.store(0, std::memory_order_relaxed);
          j.fetch_add(1);
          if(cache) {
            _schedule(worker, cache);
          }
          cache = s;
        }
      }
    }
    break;

    // non-condition task
    default: {
      for(size_t i=0; i<node->_successors.size(); ++i) {
        if(--(node->_successors[i]->_join_counter) == 0) {
          j.fetch_add(1);
          if(cache) {
            _schedule(worker, cache);
          }
          cache = node->_successors[i];
        }
      }
    }
    break;
  }

  // tear_down the invoke
  _tear_down_invoke(worker, node);

  // perform tail recursion elimination for the right-most child to reduce
  // the number of expensive pop/push operations through the task queue
  if(cache) {
    node = cache;
    //node->_state.fetch_or(Node::READY, std::memory_order_release);
    goto begin_invoke;
  }
}